

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_component_type cVar1;
  ulong uVar2;
  cgltf_buffer_view *pcVar3;
  cgltf_mesh *pcVar4;
  ulong uVar5;
  cgltf_primitive *pcVar6;
  cgltf_accessor *pcVar7;
  cgltf_primitive *pcVar8;
  cgltf_accessor *pcVar9;
  cgltf_attribute *pcVar10;
  cgltf_node **ppcVar11;
  cgltf_animation_sampler *pcVar12;
  ulong uVar13;
  cgltf_size cVar14;
  cgltf_size *pcVar15;
  cgltf_result cVar16;
  ulong uVar17;
  cgltf_accessor **ppcVar18;
  ulong uVar19;
  cgltf_node *pcVar20;
  cgltf_size cVar21;
  long lVar22;
  ulong uVar23;
  cgltf_node *pcVar24;
  ulong uVar25;
  ulong uVar26;
  cgltf_animation_path_type *pcVar27;
  ulong uVar28;
  cgltf_result unaff_R15D;
  cgltf_result cVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  char cVar34;
  
  uVar2 = data->accessors_count;
  bVar30 = uVar2 != 0;
  if (bVar30) {
    pcVar15 = &(data->accessors->sparse).values_byte_offset;
    uVar19 = 1;
    do {
      cVar14 = cgltf_calc_size(*(cgltf_type *)(pcVar15 + -0x1c),
                               *(cgltf_component_type *)(pcVar15 + -0x1d));
      if ((pcVar15[-0x18] == 0) ||
         (pcVar15[-0x1b] + cVar14 + (pcVar15[-0x1a] + -1) * pcVar15[-0x19] <=
          *(ulong *)(pcVar15[-0x18] + 0x10))) {
        if ((int)pcVar15[-6] == 0) {
LAB_00139a74:
          bVar31 = true;
          cVar16 = unaff_R15D;
        }
        else {
          cVar1 = *(cgltf_component_type *)(pcVar15 + -2);
          if (cVar1 - cgltf_component_type_r_8 < 6) {
            lVar22 = *(long *)(&DAT_0017c028 + (ulong)(cVar1 - cgltf_component_type_r_8) * 8);
          }
          else {
            lVar22 = 0;
          }
          cVar21 = ((cgltf_accessor_sparse *)(pcVar15 + -5))->count;
          pcVar3 = (cgltf_buffer_view *)pcVar15[-4];
          if ((pcVar3->size < lVar22 * cVar21 + pcVar15[-3]) ||
             (((cgltf_buffer_view *)pcVar15[-1])->size < cVar14 * cVar21 + *pcVar15))
          goto LAB_00139a33;
          bVar31 = false;
          cVar16 = cgltf_result_invalid_gltf;
          if ((cVar1 < cgltf_component_type_r_32f) && ((0x34U >> (cVar1 & 0x1f) & 1) != 0)) {
            if (pcVar3->buffer->data == (void *)0x0) goto LAB_00139a74;
            cVar14 = cgltf_calc_index_bound(pcVar3,pcVar15[-3],cVar1,cVar21);
            bVar31 = cVar14 < pcVar15[-0x1a];
            cVar16 = unaff_R15D;
            if (!bVar31) {
              cVar16 = cgltf_result_data_too_short;
            }
          }
        }
      }
      else {
LAB_00139a33:
        bVar31 = false;
        cVar16 = cgltf_result_data_too_short;
      }
      unaff_R15D = cVar16;
      if (!bVar31) break;
      bVar30 = uVar19 < uVar2;
      pcVar15 = pcVar15 + 0x26;
      bVar31 = uVar19 != uVar2;
      uVar19 = uVar19 + 1;
    } while (bVar31);
  }
  if (!bVar30) {
    uVar2 = data->buffer_views_count;
    bVar30 = uVar2 != 0;
    if (bVar30) {
      pcVar15 = &data->buffer_views->size;
      uVar19 = 1;
      do {
        if ((((cgltf_buffer_view *)(pcVar15 + -2))->buffer == (cgltf_buffer *)0x0) ||
           (*pcVar15 + pcVar15[-1] <= ((cgltf_buffer_view *)(pcVar15 + -2))->buffer->size)) {
          bVar31 = true;
        }
        else {
          unaff_R15D = cgltf_result_data_too_short;
          bVar31 = false;
        }
        if (!bVar31) break;
        bVar30 = uVar19 < uVar2;
        pcVar15 = pcVar15 + 7;
        bVar31 = uVar19 != uVar2;
        uVar19 = uVar19 + 1;
      } while (bVar31);
    }
    if (!bVar30) {
      uVar2 = data->meshes_count;
      bVar30 = uVar2 != 0;
      if (bVar30) {
        pcVar4 = data->meshes;
        uVar19 = 0;
        do {
          if ((((pcVar4[uVar19].weights != (cgltf_float *)0x0) &&
               (pcVar4[uVar19].primitives_count != 0)) &&
              ((pcVar4[uVar19].primitives)->targets_count != pcVar4[uVar19].weights_count)) ||
             (((pcVar4[uVar19].target_names != (char **)0x0 &&
               (pcVar4[uVar19].primitives_count != 0)) &&
              ((pcVar4[uVar19].primitives)->targets_count != pcVar4[uVar19].target_names_count)))) {
            unaff_R15D = cgltf_result_invalid_gltf;
            break;
          }
          uVar5 = pcVar4[uVar19].primitives_count;
          bVar31 = uVar5 != 0;
          if (bVar31) {
            pcVar6 = pcVar4[uVar19].primitives;
            cVar14 = pcVar6->targets_count;
            uVar28 = 0;
            do {
              if (pcVar6[uVar28].attributes_count != 0) {
                pcVar7 = (pcVar6[uVar28].attributes)->data;
                pcVar8 = pcVar4[uVar19].primitives;
                uVar25 = pcVar8[uVar28].attributes_count;
                bVar32 = uVar25 != 0;
                cVar16 = unaff_R15D;
                if (bVar32) {
                  cVar16 = cgltf_result_invalid_gltf;
                  if ((pcVar8[uVar28].attributes)->data->count == pcVar7->count) {
                    ppcVar18 = &pcVar8[uVar28].attributes[1].data;
                    uVar23 = 1;
                    do {
                      uVar26 = uVar23;
                      if (uVar25 == uVar26) goto LAB_00139c4d;
                      pcVar9 = *ppcVar18;
                      ppcVar18 = ppcVar18 + 3;
                      uVar23 = uVar26 + 1;
                    } while (pcVar9->count == pcVar7->count);
                    unaff_R15D = cgltf_result_invalid_gltf;
LAB_00139c4d:
                    bVar32 = uVar26 < uVar25;
                    cVar16 = unaff_R15D;
                  }
                }
                if (bVar32) {
                  bVar32 = false;
                  unaff_R15D = cVar16;
                }
                else {
                  uVar25 = pcVar8[uVar28].targets_count;
                  bVar32 = uVar25 != 0;
                  if (bVar32) {
                    uVar23 = 0;
                    cVar29 = cVar16;
                    do {
                      uVar26 = pcVar8[uVar28].targets[uVar23].attributes_count;
                      bVar33 = uVar26 != 0;
                      cVar16 = cVar29;
                      if (bVar33) {
                        pcVar10 = pcVar8[uVar28].targets[uVar23].attributes;
                        cVar16 = cgltf_result_invalid_gltf;
                        if (pcVar10->data->count == pcVar7->count) {
                          ppcVar18 = &pcVar10[1].data;
                          uVar13 = 1;
                          do {
                            uVar17 = uVar13;
                            cVar16 = cVar29;
                            if (uVar26 == uVar17) goto LAB_00139cd4;
                            pcVar9 = *ppcVar18;
                            ppcVar18 = ppcVar18 + 3;
                            uVar13 = uVar17 + 1;
                          } while (pcVar9->count == pcVar7->count);
                          cVar16 = cgltf_result_invalid_gltf;
LAB_00139cd4:
                          bVar33 = uVar17 < uVar26;
                        }
                      }
                      if (bVar33) break;
                      uVar23 = uVar23 + 1;
                      bVar32 = uVar23 < uVar25;
                      cVar29 = cVar16;
                    } while (uVar23 != uVar25);
                  }
                  if (bVar32) {
                    bVar32 = false;
                    unaff_R15D = cVar16;
                  }
                  else {
                    pcVar9 = pcVar8[uVar28].indices;
                    if (pcVar9 == (cgltf_accessor *)0x0) {
LAB_00139d6a:
                      bVar32 = true;
                      unaff_R15D = cVar16;
                    }
                    else {
                      cVar1 = pcVar9->component_type;
                      bVar32 = false;
                      unaff_R15D = cgltf_result_invalid_gltf;
                      if ((cVar1 < cgltf_component_type_r_32f) &&
                         ((0x34U >> (cVar1 & 0x1f) & 1) != 0)) {
                        pcVar3 = pcVar9->buffer_view;
                        if ((pcVar3 == (cgltf_buffer_view *)0x0) ||
                           (pcVar3->buffer->data == (void *)0x0)) goto LAB_00139d6a;
                        cVar21 = cgltf_calc_index_bound(pcVar3,pcVar9->offset,cVar1,pcVar9->count);
                        bVar32 = cVar21 < pcVar7->count;
                        unaff_R15D = cVar16;
                        if (!bVar32) {
                          unaff_R15D = cgltf_result_data_too_short;
                        }
                      }
                    }
                  }
                }
                if (!bVar32) goto LAB_00139da5;
              }
              uVar28 = uVar28 + 1;
              bVar31 = uVar28 < uVar5;
              if (uVar28 == uVar5) goto LAB_00139da5;
            } while (pcVar6[uVar28].targets_count == cVar14);
            unaff_R15D = cgltf_result_invalid_gltf;
          }
LAB_00139da5:
          if (bVar31) break;
          uVar19 = uVar19 + 1;
          bVar30 = uVar19 < uVar2;
        } while (uVar19 != uVar2);
      }
      if (!bVar30) {
        uVar2 = data->nodes_count;
        bVar30 = uVar2 != 0;
        if (bVar30) {
          pcVar15 = &data->nodes->weights_count;
          uVar19 = 1;
          do {
            if (((((cgltf_float *)pcVar15[-1] != (cgltf_float *)0x0) &&
                 (pcVar4 = (cgltf_mesh *)pcVar15[-4], pcVar4 != (cgltf_mesh *)0x0)) &&
                (pcVar4->primitives_count != 0)) && (pcVar4->primitives->targets_count != *pcVar15))
            {
              unaff_R15D = cgltf_result_invalid_gltf;
              break;
            }
            bVar30 = uVar19 < uVar2;
            pcVar15 = pcVar15 + 0x1b;
            bVar31 = uVar19 != uVar2;
            uVar19 = uVar19 + 1;
          } while (bVar31);
        }
        if (!bVar30) {
          bVar30 = uVar2 != 0;
          if (bVar30) {
            uVar19 = 0;
            do {
              pcVar20 = data->nodes[uVar19].parent;
              if (pcVar20 == (cgltf_node *)0x0) {
                pcVar24 = (cgltf_node *)0x0;
              }
              else {
                pcVar24 = pcVar20->parent;
              }
              bVar31 = pcVar24 == (cgltf_node *)0x0 || pcVar20 == (cgltf_node *)0x0;
              if (pcVar24 != (cgltf_node *)0x0 && pcVar20 != (cgltf_node *)0x0) {
                do {
                  if (pcVar20 == pcVar24) {
                    unaff_R15D = cgltf_result_invalid_gltf;
                    break;
                  }
                  if (pcVar24->parent == (cgltf_node *)0x0) {
                    pcVar24 = (cgltf_node *)0x0;
                  }
                  else {
                    pcVar24 = pcVar24->parent->parent;
                  }
                  pcVar20 = pcVar20->parent;
                  bVar31 = pcVar24 == (cgltf_node *)0x0 || pcVar20 == (cgltf_node *)0x0;
                } while (pcVar24 != (cgltf_node *)0x0 && pcVar20 != (cgltf_node *)0x0);
              }
              if (!bVar31) break;
              uVar19 = uVar19 + 1;
              bVar30 = uVar19 < uVar2;
            } while (uVar19 != uVar2);
          }
          if (!bVar30) {
            uVar2 = data->scenes_count;
            bVar30 = uVar2 != 0;
            if (bVar30) {
              uVar19 = 0;
              do {
                uVar5 = data->scenes[uVar19].nodes_count;
                bVar31 = uVar5 != 0;
                cVar16 = unaff_R15D;
                if (bVar31) {
                  ppcVar11 = data->scenes[uVar19].nodes;
                  cVar16 = cgltf_result_invalid_gltf;
                  if ((*ppcVar11)->parent == (cgltf_node *)0x0) {
                    uVar28 = 1;
                    do {
                      uVar25 = uVar28;
                      if (uVar5 == uVar25) goto LAB_00139f55;
                      uVar28 = uVar25 + 1;
                    } while (ppcVar11[uVar25]->parent == (cgltf_node *)0x0);
                    unaff_R15D = cgltf_result_invalid_gltf;
LAB_00139f55:
                    bVar31 = uVar25 < uVar5;
                    cVar16 = unaff_R15D;
                  }
                }
                unaff_R15D = cVar16;
                if (bVar31) break;
                uVar19 = uVar19 + 1;
                bVar30 = uVar19 < uVar2;
              } while (uVar19 != uVar2);
            }
            if (!bVar30) {
              if (data->animations_count == 0) {
                unaff_R15D = cgltf_result_success;
              }
              else {
                cVar14 = 0;
                cVar16 = unaff_R15D;
                do {
                  uVar2 = data->animations[cVar14].channels_count;
                  bVar30 = uVar2 != 0;
                  if (bVar30) {
                    pcVar27 = &(data->animations[cVar14].channels)->target_path;
                    uVar19 = 1;
                    do {
                      if (*(cgltf_node **)(pcVar27 + -2) == (cgltf_node *)0x0) {
                        cVar34 = '*';
                        cVar29 = cVar16;
                      }
                      else {
                        cVar21 = 1;
                        if (*pcVar27 == cgltf_animation_path_type_weights) {
                          pcVar4 = (*(cgltf_node **)(pcVar27 + -2))->mesh;
                          cVar34 = '\x01';
                          cVar29 = cgltf_result_invalid_gltf;
                          if ((pcVar4 == (cgltf_mesh *)0x0) || (pcVar4->primitives_count == 0))
                          goto LAB_0013a058;
                          cVar21 = pcVar4->primitives->targets_count;
                        }
                        pcVar12 = ((cgltf_animation_channel *)(pcVar27 + -4))->sampler;
                        cVar34 = cVar21 * pcVar12->input->count *
                                 ((ulong)(pcVar12->interpolation ==
                                         cgltf_interpolation_type_cubic_spline) * 2 + 1) -
                                 pcVar12->output->count != 0;
                        cVar29 = cVar16;
                        if ((bool)cVar34) {
                          cVar29 = cgltf_result_data_too_short;
                        }
                      }
LAB_0013a058:
                      cVar16 = cVar29;
                      if ((cVar34 != '*') && (cVar34 != '\0')) break;
                      bVar30 = uVar19 < uVar2;
                      pcVar27 = pcVar27 + 10;
                      bVar31 = uVar19 != uVar2;
                      uVar19 = uVar19 + 1;
                    } while (bVar31);
                  }
                  if (bVar30) {
                    return cVar16;
                  }
                  cVar14 = cVar14 + 1;
                  unaff_R15D = cgltf_result_success;
                } while (cVar14 != data->animations_count);
              }
            }
          }
        }
      }
    }
  }
  return unaff_R15D;
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
    for (cgltf_size i = 0; i < data->accessors_count; ++i)
    {
        cgltf_accessor* accessor = &data->accessors[i];

        cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

        if (accessor->buffer_view)
        {
            cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

            if (accessor->buffer_view->size < req_size)
            {
                return cgltf_result_data_too_short;
            }
        }

        if (accessor->is_sparse)
        {
            cgltf_accessor_sparse* sparse = &accessor->sparse;

            cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
            cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
            cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

            if (sparse->indices_buffer_view->size < indices_req_size ||
                sparse->values_buffer_view->size < values_req_size)
            {
                return cgltf_result_data_too_short;
            }

            if (sparse->indices_component_type != cgltf_component_type_r_8u &&
                sparse->indices_component_type != cgltf_component_type_r_16u &&
                sparse->indices_component_type != cgltf_component_type_r_32u)
            {
                return cgltf_result_invalid_gltf;
            }

            if (sparse->indices_buffer_view->buffer->data)
            {
                cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

                if (index_bound >= accessor->count)
                {
                    return cgltf_result_data_too_short;
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
    {
        cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

        if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
        {
            return cgltf_result_data_too_short;
        }
    }

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        if (data->meshes[i].weights)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        if (data->meshes[i].target_names)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
            {
                return cgltf_result_invalid_gltf;
            }

            if (data->meshes[i].primitives[j].attributes_count)
            {
                cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
                {
                    if (data->meshes[i].primitives[j].attributes[k].data->count != first->count)
                    {
                        return cgltf_result_invalid_gltf;
                    }
                }

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
                {
                    for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                    {
                        if (data->meshes[i].primitives[j].targets[k].attributes[m].data->count != first->count)
                        {
                            return cgltf_result_invalid_gltf;
                        }
                    }
                }

                cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

                if (indices &&
                    indices->component_type != cgltf_component_type_r_8u &&
                    indices->component_type != cgltf_component_type_r_16u &&
                    indices->component_type != cgltf_component_type_r_32u)
                {
                    return cgltf_result_invalid_gltf;
                }

                if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
                {
                    cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

                    if (index_bound >= first->count)
                    {
                        return cgltf_result_data_too_short;
                    }
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        if (data->nodes[i].weights && data->nodes[i].mesh)
        {
            if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        cgltf_node* p1 = data->nodes[i].parent;
        cgltf_node* p2 = p1 ? p1->parent : NULL;

        while (p1 && p2)
        {
            if (p1 == p2)
            {
                return cgltf_result_invalid_gltf;
            }

            p1 = p1->parent;
            p2 = p2->parent ? p2->parent->parent : NULL;
        }
    }

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
        {
            if (data->scenes[i].nodes[j]->parent)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
        {
            cgltf_animation_channel* channel = &data->animations[i].channels[j];

            if (!channel->target_node)
            {
                continue;
            }

            cgltf_size components = 1;

            if (channel->target_path == cgltf_animation_path_type_weights)
            {
                if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
                {
                    return cgltf_result_invalid_gltf;
                }

                components = channel->target_node->mesh->primitives[0].targets_count;
            }

            cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

            if (channel->sampler->input->count * components * values != channel->sampler->output->count)
            {
                return cgltf_result_data_too_short;
            }
        }
    }

    return cgltf_result_success;
}